

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeResizeBilinearLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  ShapeConstraint *pSVar1;
  int iVar2;
  string *psVar3;
  mapped_type *pmVar4;
  ShapeRange *pSVar5;
  ShapeRange *pSVar6;
  ResizeBilinearLayerParams *from;
  uint64 uVar7;
  uint64 local_1d8;
  uint64 local_1c0;
  ShapeRange local_140;
  ShapeRange local_120;
  ShapeRange local_100;
  uint64 local_d0;
  size_t target_w;
  size_t target_h;
  ResizeBilinearLayerParams resize;
  ShapeRange local_68;
  ShapeRange local_48;
  mapped_type *local_28;
  ShapeConstraint *outputShape;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  inputShape = (ShapeConstraint *)specLayer;
  specLayer_local = (NeuralNetworkLayer *)this;
  psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  outputShape = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                ::operator[](&this->blobShapes,psVar3);
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_((NeuralNetworkLayer *)inputShape,0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](&this->blobShapes,psVar3);
  local_28 = pmVar4;
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_((NeuralNetworkLayer *)inputShape,0);
  ShapeConstraint::setName(pmVar4,psVar3);
  pmVar4 = local_28;
  pSVar5 = ShapeConstraint::sequenceRange(local_28);
  pSVar6 = ShapeConstraint::sequenceRange(outputShape);
  ShapeRange::intersect(&local_48,pSVar5,pSVar6);
  ShapeConstraint::updateSequenceRange(pmVar4,&local_48);
  pmVar4 = local_28;
  pSVar5 = ShapeConstraint::batchRange(local_28);
  pSVar6 = ShapeConstraint::batchRange(outputShape);
  ShapeRange::intersect(&local_68,pSVar5,pSVar6);
  ShapeConstraint::updateBatchRange(pmVar4,&local_68);
  pmVar4 = local_28;
  pSVar5 = ShapeConstraint::channelRange(local_28);
  pSVar6 = ShapeConstraint::channelRange(outputShape);
  ShapeRange::intersect((ShapeRange *)&resize._cached_size_,pSVar5,pSVar6);
  ShapeConstraint::updateChannelRange(pmVar4,(ShapeRange *)&resize._cached_size_);
  from = Specification::NeuralNetworkLayer::resizebilinear((NeuralNetworkLayer *)inputShape);
  Specification::ResizeBilinearLayerParams::ResizeBilinearLayerParams
            ((ResizeBilinearLayerParams *)&target_h,from);
  target_w = 1;
  local_d0 = 1;
  iVar2 = Specification::ResizeBilinearLayerParams::targetsize_size
                    ((ResizeBilinearLayerParams *)&target_h);
  if (iVar2 == 2) {
    uVar7 = Specification::ResizeBilinearLayerParams::targetsize
                      ((ResizeBilinearLayerParams *)&target_h,0);
    if (uVar7 == 0) {
      local_1c0 = 1;
    }
    else {
      local_1c0 = Specification::ResizeBilinearLayerParams::targetsize
                            ((ResizeBilinearLayerParams *)&target_h,0);
    }
    target_w = local_1c0;
    uVar7 = Specification::ResizeBilinearLayerParams::targetsize
                      ((ResizeBilinearLayerParams *)&target_h,1);
    if (uVar7 == 0) {
      local_1d8 = 1;
    }
    else {
      local_1d8 = Specification::ResizeBilinearLayerParams::targetsize
                            ((ResizeBilinearLayerParams *)&target_h,1);
    }
    local_d0 = local_1d8;
  }
  ShapeConstraint::setHeight(local_28,target_w);
  ShapeConstraint::setWidth(local_28,local_d0);
  pSVar1 = outputShape;
  pSVar5 = ShapeConstraint::sequenceRange(outputShape);
  pSVar6 = ShapeConstraint::sequenceRange(local_28);
  ShapeRange::intersect(&local_100,pSVar5,pSVar6);
  ShapeConstraint::updateSequenceRange(pSVar1,&local_100);
  pSVar1 = outputShape;
  pSVar5 = ShapeConstraint::batchRange(outputShape);
  pSVar6 = ShapeConstraint::batchRange(local_28);
  ShapeRange::intersect(&local_120,pSVar5,pSVar6);
  ShapeConstraint::updateBatchRange(pSVar1,&local_120);
  pSVar1 = outputShape;
  pSVar5 = ShapeConstraint::channelRange(outputShape);
  pSVar6 = ShapeConstraint::channelRange(local_28);
  ShapeRange::intersect(&local_140,pSVar5,pSVar6);
  ShapeConstraint::updateChannelRange(pSVar1,&local_140);
  Specification::ResizeBilinearLayerParams::~ResizeBilinearLayerParams
            ((ResizeBilinearLayerParams *)&target_h);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeResizeBilinearLayer(const Specification::NeuralNetworkLayer& specLayer) {

    // Input shape: [Seq, B, C, H_in, W_out]
    // Output shape: [Seq, B, C, H_out, W_out]

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Resize Bilinear layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Resize Bilinear layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    // For forward pass: update the output shape ranges
    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape.batchRange()));
    outputShape.updateChannelRange(outputShape.channelRange().intersect(inputShape.channelRange()));

    Specification::ResizeBilinearLayerParams resize = specLayer.resizebilinear();

    size_t target_h = 1;
    size_t target_w = 1;

    if (resize.targetsize_size() == 2) {
        target_h = (resize.targetsize(0) == 0) ? 1 : (size_t)resize.targetsize(0); //height
        target_w = (resize.targetsize(1) == 0) ? 1 : (size_t)resize.targetsize(1); //width
    }

    outputShape.setHeight(target_h);
    outputShape.setWidth(target_w);

    // For backward pass: update the input shape ranges
    inputShape.updateSequenceRange(inputShape.sequenceRange().intersect(outputShape.sequenceRange()));
    inputShape.updateBatchRange(inputShape.batchRange().intersect(outputShape.batchRange()));
    inputShape.updateChannelRange(inputShape.channelRange().intersect(outputShape.channelRange()));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Resize Bilinear layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Resize Bilinear layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}